

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_tree.hpp
# Opt level: O2

void tao::pegtl::parse_tree::internal::make_control<queryparse::store,tao::pegtl::normal>::
     control<queryparse::paths_construct,true>::
     success<tao::pegtl::string_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>,tao::pegtl::parse_tree::node>
               (string_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *in,state<tao::pegtl::parse_tree::node> *state)

{
  pointer puVar1;
  node *pnVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  _Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false> local_28;
  __uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  local_20;
  
  puVar1 = (state->stack).
           super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pnVar2 = puVar1[-1]._M_t.
           super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
           ._M_t.
           super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
           .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl;
  puVar1[-1]._M_t.
  super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ._M_t.
  super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
  .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl = (node *)0x0;
  std::
  vector<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
  ::pop_back(&state->stack);
  pcVar3 = (in->
           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .m_current.data;
  sVar4 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte;
  sVar5 = (in->
          super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ).
          super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          .m_current.byte_in_line;
  *(size_t *)
   ((long)&(pnVar2->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content +
   0x38) = (in->
           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ).
           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           .m_current.line;
  *(size_t *)
   ((long)&(pnVar2->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content +
   0x40) = sVar5;
  ((iterator *)
  ((long)&(pnVar2->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content + 0x28
  ))->data = pcVar3;
  *(size_t *)
   ((long)&(pnVar2->super_basic_node<tao::pegtl::parse_tree::node>).super_default_node_content +
   0x30) = sVar4;
  local_20._M_t.
  super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
  .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl =
       (tuple<tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>)
       (_Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
        )0x0;
  local_28._M_head_impl = pnVar2;
  std::
  vector<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>,std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>>>
  ::
  emplace_back<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>>
            ((vector<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>,std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,std::default_delete<tao::pegtl::parse_tree::node>>>>
              *)(state->stack).
                super__Vector_base<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>,_std::allocator<std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
                super___uniq_ptr_impl<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                ._M_t.
                super__Tuple_impl<0UL,_tao::pegtl::parse_tree::node_*,_std::default_delete<tao::pegtl::parse_tree::node>_>
                .super__Head_base<0UL,_tao::pegtl::parse_tree::node_*,_false>._M_head_impl,
             (unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
              *)&local_28);
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::~unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)&local_28);
  std::unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
  ::~unique_ptr((unique_ptr<tao::pegtl::parse_tree::node,_std::default_delete<tao::pegtl::parse_tree::node>_>
                 *)&local_20);
  return;
}

Assistant:

static void success( const Input& in, state< Node >& state, States&&... st )
               {
                  auto n = std::move( state.back() );
                  state.pop_back();
                  n->template success< Rule >( in, st... );
                  transform< Node, S< Rule > >::call( n, st... );
                  if( n ) {
                     state.back()->emplace_back( std::move( n ), st... );
                  }
               }